

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcolumnviewgrip_p.cpp
# Opt level: O0

void QColumnViewGrip::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  QColumnViewGrip *_t;
  int in_stack_ffffffffffffffcc;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    gripMoved((QColumnViewGrip *)0x86fa7a,in_stack_ffffffffffffffcc);
  }
  if (in_ESI == 5) {
    QtMocHelpers::indexOfMethod<void(QColumnViewGrip::*)(int)>(in_RCX,(void **)gripMoved,0,0);
  }
  return;
}

Assistant:

void QColumnViewGrip::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QColumnViewGrip *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->gripMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QColumnViewGrip::*)(int )>(_a, &QColumnViewGrip::gripMoved, 0))
            return;
    }
}